

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBytes::Clear(TensorValue_RepeatedBytes *this)

{
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->values_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TensorValue_RepeatedBytes::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.TensorValue.RepeatedBytes)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  values_.ClearToEmpty();
  _internal_metadata_.Clear<std::string>();
}